

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall E64::stats_t::reset(stats_t *this)

{
  rep rVar1;
  
  this->total_time = 0;
  this->total_idle_time = 0;
  this->framecounter = '\0';
  this->framecounter_interval = '\b';
  this->status_bar_framecounter = '\0';
  this->status_bar_framecounter_interval = '\x1e';
  this->smoothed_audio_queue_size = 8192.0;
  this->smoothed_framerate = 60.0;
  this->smoothed_mhz = 11.0;
  this->smoothed_idle_per_frame = 8333.0;
  this->smoothed_percentage_blitter = 0.0;
  this->alpha = 0.8999999761581421;
  this->frametime = 0x411a;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->then).__d.__r = rVar1;
  (this->now).__d.__r = rVar1;
  return;
}

Assistant:

void E64::stats_t::reset()
{
    total_time = 0;
    total_idle_time = 0;
    
    framecounter = 0;
    framecounter_interval = 8;
    
    status_bar_framecounter = 0;
    status_bar_framecounter_interval = FPS / 2;

    smoothed_audio_queue_size = AUDIO_BUFFER_SIZE;
    
    smoothed_framerate = FPS;
    
    smoothed_mhz = CPU_CLOCK_SPEED/(1000*1000);
    
    smoothed_idle_per_frame = 1000000 / (FPS * 2);
    
    smoothed_percentage_blitter = 0;
    
    alpha = 0.90f;
    
    frametime = 1000000 / FPS;

    now = then = std::chrono::steady_clock::now();
}